

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexReadHdr(Wal *pWal,int *pChanged)

{
  bool bVar1;
  int iVar2;
  u32 *page0;
  u32 *local_20;
  
  iVar2 = walIndexPage(pWal,0,&local_20);
  if (iVar2 != 0) {
    return iVar2;
  }
  if ((local_20 != (u32 *)0x0) && (iVar2 = walIndexTryHdr(pWal,pChanged), iVar2 == 0)) {
    iVar2 = 0;
    goto LAB_0012957b;
  }
  if ((pWal->readOnly & 2) != 0) {
    if (pWal->exclusiveMode != '\0') {
      return 0x108;
    }
    iVar2 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,6);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (pWal->exclusiveMode != '\0') {
      return 0x108;
    }
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,5);
    return 0x108;
  }
  if ((pWal->exclusiveMode == '\0') &&
     (iVar2 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10), iVar2 != 0)) {
    return iVar2;
  }
  pWal->writeLock = '\x01';
  iVar2 = walIndexPage(pWal,0,&local_20);
  if (iVar2 == 0) {
    iVar2 = walIndexTryHdr(pWal,pChanged);
    if (iVar2 != 0) {
      iVar2 = walIndexRecover(pWal);
      *pChanged = 1;
      goto LAB_001294fb;
    }
    pWal->writeLock = '\0';
    iVar2 = 0;
    if (pWal->exclusiveMode != '\0') goto LAB_0012957b;
    bVar1 = true;
    iVar2 = 0;
  }
  else {
LAB_001294fb:
    pWal->writeLock = '\0';
    if (pWal->exclusiveMode != '\0') {
      return iVar2;
    }
    bVar1 = false;
  }
  (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,9);
  if (!bVar1) {
    return iVar2;
  }
LAB_0012957b:
  if ((pWal->hdr).iVersion != 0x2de218) {
    iVar2 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xdf24,
                "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
  }
  return iVar2;
}

Assistant:

static int walIndexReadHdr(Wal *pWal, int *pChanged){
  int rc;                         /* Return code */
  int badHdr;                     /* True if a header read failed */
  volatile u32 *page0;            /* Chunk of wal-index containing header */

  /* Ensure that page 0 of the wal-index (the page that contains the 
  ** wal-index header) is mapped. Return early if an error occurs here.
  */
  assert( pChanged );
  rc = walIndexPage(pWal, 0, &page0);
  if( rc!=SQLITE_OK ){
    return rc;
  };
  assert( page0 || pWal->writeLock==0 );

  /* If the first page of the wal-index has been mapped, try to read the
  ** wal-index header immediately, without holding any lock. This usually
  ** works, but may fail if the wal-index header is corrupt or currently 
  ** being modified by another thread or process.
  */
  badHdr = (page0 ? walIndexTryHdr(pWal, pChanged) : 1);

  /* If the first attempt failed, it might have been due to a race
  ** with a writer.  So get a WRITE lock and try again.
  */
  assert( badHdr==0 || pWal->writeLock==0 );
  if( badHdr ){
    if( pWal->readOnly & WAL_SHM_RDONLY ){
      if( SQLITE_OK==(rc = walLockShared(pWal, WAL_WRITE_LOCK)) ){
        walUnlockShared(pWal, WAL_WRITE_LOCK);
        rc = SQLITE_READONLY_RECOVERY;
      }
    }else if( SQLITE_OK==(rc = walLockExclusive(pWal, WAL_WRITE_LOCK, 1)) ){
      pWal->writeLock = 1;
      if( SQLITE_OK==(rc = walIndexPage(pWal, 0, &page0)) ){
        badHdr = walIndexTryHdr(pWal, pChanged);
        if( badHdr ){
          /* If the wal-index header is still malformed even while holding
          ** a WRITE lock, it can only mean that the header is corrupted and
          ** needs to be reconstructed.  So run recovery to do exactly that.
          */
          rc = walIndexRecover(pWal);
          *pChanged = 1;
        }
      }
      pWal->writeLock = 0;
      walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    }
  }

  /* If the header is read successfully, check the version number to make
  ** sure the wal-index was not constructed with some future format that
  ** this version of SQLite cannot understand.
  */
  if( badHdr==0 && pWal->hdr.iVersion!=WALINDEX_MAX_VERSION ){
    rc = SQLITE_CANTOPEN_BKPT;
  }

  return rc;
}